

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Interrogator.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Interrogator::IFF_Layer3Interrogator
          (IFF_Layer3Interrogator *this,SimulationIdentifier *ReportingSimulation,
          Mode5InterrogatorBasicData *Data,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *Records)

{
  KUINT16 KVar1;
  undefined1 uVar2;
  KUINT32 KVar3;
  
  IFF_Layer3::IFF_Layer3(&this->super_IFF_Layer3);
  (this->super_IFF_Layer3).super_LayerHeader.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_Layer3Interrogator_0022be60;
  Mode5InterrogatorBasicData::Mode5InterrogatorBasicData(&this->m_BasicData);
  KVar1 = ReportingSimulation->m_ui16ApplicationID;
  (this->super_IFF_Layer3).m_RptSim.m_ui16SiteID = ReportingSimulation->m_ui16SiteID;
  (this->super_IFF_Layer3).m_RptSim.m_ui16ApplicationID = KVar1;
  (this->m_BasicData).m_Status.m_StatusUnion = (Data->m_Status).m_StatusUnion;
  uVar2 = Data->field_0x19;
  KVar1 = Data->m_ui16Padding1;
  KVar3 = Data->m_ui32MsgFormats;
  (this->m_BasicData).m_ui8Padding = Data->m_ui8Padding;
  (this->m_BasicData).field_0x19 = uVar2;
  (this->m_BasicData).m_ui16Padding1 = KVar1;
  (this->m_BasicData).m_ui32MsgFormats = KVar3;
  KVar1 = (Data->m_InterrogatedID).super_SimulationIdentifier.m_ui16ApplicationID;
  (this->m_BasicData).m_InterrogatedID.super_SimulationIdentifier.m_ui16SiteID =
       (Data->m_InterrogatedID).super_SimulationIdentifier.m_ui16SiteID;
  (this->m_BasicData).m_InterrogatedID.super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  *(undefined2 *)&(this->m_BasicData).m_InterrogatedID.super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(Data->m_InterrogatedID).super_SimulationIdentifier.field_0xc;
  (this->m_BasicData).m_ui16Padding2 = Data->m_ui16Padding2;
  IFF_Layer3::SetDataRecords(&this->super_IFF_Layer3,Records);
  return;
}

Assistant:

IFF_Layer3Interrogator::IFF_Layer3Interrogator( const SimulationIdentifier & ReportingSimulation, const Mode5InterrogatorBasicData & Data,
                                              std::vector<StdVarPtr> & Records ) 
{
	m_RptSim = ReportingSimulation;
	m_BasicData = Data;
	SetDataRecords( Records );
}